

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

void PDHG_Compute_Primal_Infeasibility
               (CUPDLPwork *work,cupdlp_float *y,cupdlp_float *dSlackPos,cupdlp_float *dSlackNeg,
               cupdlp_float *aty,cupdlp_float dualObj,cupdlp_float *dPrimalInfeasObj,
               cupdlp_float *dPrimalInfeasRes)

{
  CUPDLPproblem *pCVar1;
  CUPDLPresobj *pCVar2;
  double dVar3;
  cupdlp_float slackNegSq;
  cupdlp_float yNrmSq;
  cupdlp_float alpha;
  cupdlp_float local_a0;
  cupdlp_float local_98;
  undefined8 uStack_90;
  cupdlp_float local_80;
  cupdlp_float *local_78;
  cupdlp_float *local_70;
  CUPDLPscaling *local_68;
  cupdlp_float local_60;
  double local_58;
  undefined8 uStack_50;
  cupdlp_float local_40;
  cupdlp_float local_38;
  
  pCVar1 = work->problem;
  pCVar2 = work->resobj;
  local_68 = work->scaling;
  local_40 = 1.0;
  local_a0 = 1.0;
  local_60 = 1.0;
  local_80 = dualObj;
  local_78 = dPrimalInfeasObj;
  local_70 = aty;
  memcpy(pCVar2->dualInfeasRay,y,(long)pCVar1->data->nRows << 3);
  memcpy(pCVar2->dualInfeasLbRay,dSlackPos,(long)pCVar1->data->nCols << 3);
  memcpy(pCVar2->dualInfeasUbRay,dSlackNeg,(long)pCVar1->data->nCols << 3);
  cupdlp_twoNormSquared(work,pCVar1->data->nRows,pCVar2->dualInfeasRay,&local_40);
  cupdlp_twoNormSquared(work,pCVar1->data->nCols,pCVar2->dualInfeasLbRay,&local_a0);
  cupdlp_twoNormSquared(work,pCVar1->data->nCols,pCVar2->dualInfeasUbRay,&local_60);
  dVar3 = local_40 + local_a0 + local_60;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  local_58 = (double)(~-(ulong)(dVar3 < 1e-08) & (ulong)dVar3 |
                     -(ulong)(dVar3 < 1e-08) & 0x3ff0000000000000);
  uStack_50 = 0;
  local_98 = 1.0 / local_58;
  uStack_90 = 0;
  cupdlp_scaleVector(work,local_98,pCVar2->dualInfeasRay,pCVar1->data->nRows);
  cupdlp_scaleVector(work,local_98,pCVar2->dualInfeasLbRay,pCVar1->data->nCols);
  cupdlp_scaleVector(work,local_98,pCVar2->dualInfeasUbRay,pCVar1->data->nCols);
  *local_78 = ((local_80 - pCVar1->offset) / pCVar1->sense_origin) / local_58;
  memcpy(pCVar2->dualInfeasConstr,local_70,(long)pCVar1->data->nCols << 3);
  cupdlp_scaleVector(work,local_98,pCVar2->dualInfeasConstr,pCVar1->data->nCols);
  local_38 = 1.0;
  cupdlp_axpy(work,pCVar1->data->nCols,&local_38,pCVar2->dualInfeasLbRay,pCVar2->dualInfeasConstr);
  local_38 = -1.0;
  cupdlp_axpy(work,pCVar1->data->nCols,&local_38,pCVar2->dualInfeasUbRay,pCVar2->dualInfeasConstr);
  if (local_68->ifScaled != 0) {
    cupdlp_edot(pCVar2->dualInfeasConstr,work->colScale,pCVar1->data->nCols);
  }
  cupdlp_twoNorm(work,pCVar1->data->nCols,pCVar2->dualInfeasConstr,dPrimalInfeasRes);
  return;
}

Assistant:

void PDHG_Compute_Primal_Infeasibility(CUPDLPwork *work, const cupdlp_float *y,
                                       const cupdlp_float *dSlackPos,
                                       const cupdlp_float *dSlackNeg,
                                       const cupdlp_float *aty,
                                       const cupdlp_float dualObj,
                                       cupdlp_float *dPrimalInfeasObj,
                                       cupdlp_float *dPrimalInfeasRes) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;

  cupdlp_float alpha;

  cupdlp_float yNrmSq = 1.0;
  cupdlp_float slackPosNrmSq = 1.0;
  cupdlp_float slackNegSq = 1.0;
  cupdlp_float dScale = 1.0;

  // cupdlp_float dConstrResSq = 0.0;
  // y and lambda must be feasible, no need to check bound
  // cupdlp_float dBoundLbResSq = 0.0;
  // cupdlp_float dBoundUbResSq = 0.0;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_twoNormSquared(work, problem->data->nRows, y, &yNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, dSlackPos, &slackPosNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, dSlackNeg, &slackNegSq);
  dScale = sqrt(yNrmSq + slackPosNrmSq + slackNegSq);
  // dScale /= sqrt(problem->data->nRows + 2 * problem->data->nCols);
  if (dScale < 1e-8) {
    dScale = 1.0;
  }

  // dual obj
  *dPrimalInfeasObj =
      (dualObj - problem->offset) / problem->sense_origin / dScale;

  // dual constraints [ATy1 + GTy2 + lambda]

  cupdlp_primal_infeasibility_kernel_cuda(work->buffer2, aty, dSlackPos,
                                          dSlackNeg, work->colScale, 1.0 / dScale,
                                          scaling->ifScaled, problem->data->nCols);

  // cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasConstr,
  //                       &dConstrResSq);
  cupdlp_twoNorm(work, problem->data->nCols, work->buffer2,
                 dPrimalInfeasRes);

  // dual bound
  // always satisfied, no need to check

#else

  // y, ldb ray
  CUPDLP_COPY_VEC(resobj->dualInfeasRay, y, cupdlp_float, problem->data->nRows);
  CUPDLP_COPY_VEC(resobj->dualInfeasLbRay, dSlackPos, cupdlp_float,
                  problem->data->nCols);
  CUPDLP_COPY_VEC(resobj->dualInfeasUbRay, dSlackNeg, cupdlp_float,
                  problem->data->nCols);
  cupdlp_twoNormSquared(work, problem->data->nRows, resobj->dualInfeasRay,
                        &yNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasLbRay,
                        &slackPosNrmSq);
  cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasUbRay,
                        &slackNegSq);
  dScale = sqrt(yNrmSq + slackPosNrmSq + slackNegSq);
  // dScale /= sqrt(problem->data->nRows + 2 * problem->data->nCols);
  if (dScale < 1e-8) {
    dScale = 1.0;
  }
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasRay,
                     problem->data->nRows);
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasLbRay,
                     problem->data->nCols);
  cupdlp_scaleVector(work, 1 / dScale, resobj->dualInfeasUbRay,
                     problem->data->nCols);

  // dual obj
  *dPrimalInfeasObj =
      (dualObj - problem->offset) / problem->sense_origin / dScale;

  // dual constraints [ATy1 + GTy2 + lambda]
  CUPDLP_COPY_VEC(resobj->dualInfeasConstr, aty, cupdlp_float,
                  problem->data->nCols);
  cupdlp_scaleVector(work, 1.0 / dScale, resobj->dualInfeasConstr,
                     problem->data->nCols);
  alpha = 1.0;
  cupdlp_axpy(work, problem->data->nCols, &alpha, resobj->dualInfeasLbRay,
              resobj->dualInfeasConstr);
  alpha = -1.0;
  cupdlp_axpy(work, problem->data->nCols, &alpha, resobj->dualInfeasUbRay,
              resobj->dualInfeasConstr);
  if (scaling->ifScaled) {
    cupdlp_edot(resobj->dualInfeasConstr, work->colScale, problem->data->nCols);
  }
  // cupdlp_twoNormSquared(work, problem->data->nCols, resobj->dualInfeasConstr,
  //                       &dConstrResSq);
  cupdlp_twoNorm(work, problem->data->nCols, resobj->dualInfeasConstr,
                 dPrimalInfeasRes);

  // dual bound
  // always satisfied, no need to check

#endif

}